

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmax_distance.cpp
# Opt level: O2

double __thiscall
ProbabEstimator::getProbabGt0
          (ProbabEstimator *this,double minValInRetained,int numReplaced,int pathLength)

{
  undefined1 auVar1 [16];
  DistribFunction *this_00;
  int exp;
  double base;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [64];
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 extraout_var [56];
  
  this_00 = this->distribFunction;
  base = DistribFunction::getDistrib(this_00,minValInRetained);
  exp = ~numReplaced + pathLength;
  dVar5 = 0.0;
  while( true ) {
    if (pathLength <= numReplaced) break;
    numReplaced = numReplaced + 1;
    dVar2 = combNumber((ProbabEstimator *)this_00,pathLength,numReplaced);
    dVar3 = pown((ProbabEstimator *)this_00,1.0 - base,numReplaced);
    auVar4._0_8_ = pown((ProbabEstimator *)this_00,base,exp);
    auVar4._8_56_ = extraout_var;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = dVar5;
    exp = exp + -1;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = dVar3 * dVar2;
    auVar1 = vfmadd231sd_fma(auVar6,auVar4._0_16_,auVar1);
    dVar5 = auVar1._0_8_;
  }
  return dVar5;
}

Assistant:

double ProbabEstimator::getProbabGt0( const double minValInRetained, const int numReplaced, const int pathLength ){

    double  PAr = distribFunction->getDistrib(minValInRetained);
    double cPAr = 1.0-PAr;

    double val = 0.0;
    for ( int i = numReplaced+1; i <= pathLength; ++i ){
        double val0 = (double)combNumber( pathLength, i )*pown( cPAr, i )*pown(PAr, (pathLength-i));
        val += val0;
    }

    return val;
}